

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

ExecuteResult __thiscall Statement::executeSelect(Statement *this,Table *t)

{
  uint32_t uVar1;
  Cursor *this_00;
  char *src;
  uint local_8c;
  int i;
  Cursor *c;
  Row r;
  Table *t_local;
  Statement *this_local;
  
  r.email._56_8_ = t;
  this_00 = Table::tableStart(t);
  local_8c = 0;
  while( true ) {
    uVar1 = Table::rows((Table *)r.email._56_8_);
    if (uVar1 <= local_8c) break;
    src = Cursor::value(this_00);
    Row::deserialize((Row *)((long)&c + 4),src);
    Row::print((Row *)((long)&c + 4));
    Cursor::advance(this_00);
    local_8c = local_8c + 1;
  }
  if (this_00 != (Cursor *)0x0) {
    operator_delete(this_00,0x18);
  }
  return ExecuteSucess;
}

Assistant:

ExecuteResult Statement::executeSelect(Table *t) {
		Row r;
		Cursor *c = t->tableStart();
		for (int i = 0; i < t->rows(); ++i) {
			r.deserialize(c->value());
			r.print();
			c->advance();
		}
		delete c;
		return ExecuteSucess;
	}